

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

void wipefile(char *aFilename)

{
  int iVar1;
  FILE *__stream;
  FILE *lIn;
  stat st;
  int i;
  char *aFilename_local;
  
  iVar1 = stat(aFilename,(stat *)&lIn);
  if (iVar1 == 0) {
    __stream = fopen(aFilename,"w");
    if (__stream != (FILE *)0x0) {
      for (st.__glibc_reserved[2]._4_4_ = 0; (long)st.__glibc_reserved[2]._4_4_ < (long)st.st_rdev;
          st.__glibc_reserved[2]._4_4_ = st.__glibc_reserved[2]._4_4_ + 1) {
        fputc(0x41,__stream);
      }
    }
    fclose(__stream);
  }
  return;
}

Assistant:

static void wipefile(char const * const aFilename)
{
        int i;
        struct stat st;
        FILE * lIn;

        if (stat(aFilename, &st) == 0)
        {
                if ((lIn = fopen(aFilename, "w")))
                {
                        for (i = 0; i < st.st_size; i++)
                        {
                                fputc('A', lIn);
                        }
                }
                fclose(lIn);
        }
}